

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O1

error_code __thiscall
pstore::exchange::import_ns::rule::
push<pstore::exchange::import_ns::transaction_array<pstore::lock_guard<pstore::transaction_mutex>>,pstore::exchange::import_ns::string_mapping*,pstore::exchange::import_ns::string_mapping*>
          (rule *this,string_mapping *args,string_mapping *args_1)

{
  iterator *piVar1;
  context *pcVar2;
  _Elt_pointer puVar3;
  undefined1 auVar4 [16];
  rule *prVar5;
  ulong uVar6;
  pointer __p;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_50;
  _Head_base<0UL,_pstore::exchange::import_ns::transaction_array<pstore::lock_guard<pstore::transaction_mutex>_>_*,_false>
  local_48;
  not_null<pstore::exchange::import_ns::string_mapping_*> local_40;
  not_null<pstore::exchange::import_ns::string_mapping_*> local_38;
  
  pcVar2 = (this->context_).ptr_;
  prVar5 = (rule *)operator_new(0x20);
  local_38.ptr_ = args;
  gsl::not_null<pstore::exchange::import_ns::string_mapping_*>::ensure_invariant(&local_38);
  local_40.ptr_ = args_1;
  gsl::not_null<pstore::exchange::import_ns::string_mapping_*>::ensure_invariant(&local_40);
  (prVar5->context_).ptr_ = pcVar2;
  prVar5->_vptr_rule = (_func_int **)&PTR__rule_0015be00;
  prVar5[1]._vptr_rule = (_func_int **)local_38.ptr_;
  prVar5[1].context_.ptr_ = (context *)local_40.ptr_;
  local_48._M_head_impl = (transaction_array<pstore::lock_guard<pstore::transaction_mutex>_> *)0x0;
  puVar3 = (pcVar2->stack).c.
           super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar3 == (pcVar2->stack).c.
                super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    local_50._M_head_impl = prVar5;
    std::
    deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
    ::
    _M_push_back_aux<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
              ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
                *)&pcVar2->stack,
               (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
                *)&local_50);
  }
  else {
    (puVar3->_M_t).
    super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
    .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl = prVar5;
    local_50._M_head_impl = (rule *)0x0;
    piVar1 = &(pcVar2->stack).c.
              super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  if (local_50._M_head_impl != (rule *)0x0) {
    (*(local_50._M_head_impl)->_vptr_rule[1])();
  }
  local_50._M_head_impl = (rule *)0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::transaction_array<pstore::lock_guard<pstore::transaction_mutex>_>,_std::default_delete<pstore::exchange::import_ns::transaction_array<pstore::lock_guard<pstore::transaction_mutex>_>_>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::transaction_array<pstore::lock_guard<pstore::transaction_mutex>_>,_std::default_delete<pstore::exchange::import_ns::transaction_array<pstore::lock_guard<pstore::transaction_mutex>_>_>_>
                 *)&local_48);
  log_top(this,true);
  uVar6 = std::_V2::system_category();
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar6;
  return (error_code)(auVar4 << 0x40);
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }